

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmepoll.c
# Opt level: O2

void socket_select(CMtrans_services_conflict svc,select_data_ptr sd,int timeout_sec,int timeout_usec
                  )

{
  uint uVar1;
  pthread_t pVar2;
  FunctionListElement *pFVar3;
  int iVar4;
  uint uVar5;
  pthread_t pVar6;
  periodic_task_handle_conflict *pp_Var7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  periodic_task_handle_conflict p_Var13;
  periodic_task_handle p_Var14;
  int local_1dc;
  timeval now;
  epoll_event events [32];
  
  if (sd->closed != 0) goto LAB_00101de1;
  local_1dc = sd->select_consistency_number;
  if ((sd->cm != (CManager)0x0) &&
     (iVar4 = (*svc->return_CM_lock_status)
                        (sd->cm,
                         "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                         ,0xee), iVar4 == 0)) {
    printf("%s:%u: failed assertion `%s\'\n",
           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
           ,0xee,"CM_LOCKED(svc, sd->cm)");
    abort();
  }
  pVar2 = sd->server_thread;
  pVar6 = pthread_self();
  if (pVar2 == 0) {
LAB_00101cb3:
    sd->server_thread = pVar6;
  }
  else if (pVar2 != pVar6) {
    fwrite("Warning:  Multiple threads calling CManager_socket_select.\n",0x3b,1,_stderr);
    fwrite("          This situation may result in unexpected I/O blocking.\n",0x40,1,_stderr);
    fprintf(_stderr,"          Server thread set to %lx.\n",pVar6);
    goto LAB_00101cb3;
  }
  if ((timeout_sec < 0) && (sd->periodic_task_list == (periodic_task_handle_conflict)0x0)) {
    (*svc->verbose)(sd->cm,CMSelectVerbose,"CMSelect blocking select");
    (*svc->drop_CM_lock)
              (sd->cm,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
               ,0x11e);
    uVar5 = epoll_wait(sd->epfd,(epoll_event *)events,0x20,-1);
    (*svc->acquire_CM_lock)
              (sd->cm,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
               ,0x121);
  }
  else {
    gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
    lVar11 = (long)timeout_sec;
    lVar12 = 0;
    pp_Var7 = &sd->periodic_task_list;
    while (p_Var13 = *pp_Var7, p_Var13 != (periodic_task_handle_conflict)0x0) {
      if (p_Var13->executing == 0xffffffffffffffff) {
        lVar9 = (p_Var13->next_time).tv_usec - now.tv_usec;
        lVar10 = lVar9 + 1000000;
        if (-1 < lVar9) {
          lVar10 = lVar9;
        }
        lVar9 = (lVar9 >> 0x3f) + ((p_Var13->next_time).tv_sec - now.tv_sec);
        if (lVar9 < 0) {
          lVar10 = 0;
        }
        if (lVar9 < 1) {
          lVar9 = 0;
        }
        if ((lVar9 < lVar11 || lVar11 == -1) || ((lVar9 == lVar11 && (lVar10 < lVar12)))) {
          lVar11 = lVar9;
          lVar12 = lVar10;
        }
      }
      pp_Var7 = &p_Var13->next;
    }
    (*svc->verbose)(sd->cm,CMSelectVerbose,"CMSelect with timeout %d sec, %d usec",lVar11,lVar12);
    (*svc->drop_CM_lock)
              (sd->cm,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
               ,0x117);
    iVar4 = (int)(lVar12 / 1000) + (int)lVar11 * 1000;
    if (lVar11 == -1) {
      iVar4 = 0;
    }
    uVar5 = epoll_wait(sd->epfd,(epoll_event *)events,0x20,iVar4);
    (*svc->acquire_CM_lock)
              (sd->cm,
               "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
               ,0x11b);
  }
  if (sd->closed == 0) {
    if (uVar5 == 0xffffffff) {
      piVar8 = __errno_location();
      iVar4 = *piVar8;
      if (iVar4 == 4) {
        return;
      }
      if (sd->select_consistency_number != local_1dc) {
        return;
      }
      if (iVar4 == 0) {
        return;
      }
      if (iVar4 != 0xb) {
        if (iVar4 != 9) {
          fprintf(_stderr,"select failed, errno %d\n");
          exit(1);
        }
        fwrite("The epoll fd is invalid. This is catastrophic.\n",0x2f,1,_stderr);
      }
    }
    if (sd->select_consistency_number != local_1dc) {
      return;
    }
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    lVar11 = 0;
    while( true ) {
      if ((ulong)uVar5 * 0xc + 0xc == lVar11 + 0xc) {
        p_Var13 = sd->periodic_task_list;
        if (p_Var13 != (periodic_task_handle_conflict)0x0) {
          gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
          while (p_Var13 != (periodic_task_handle_conflict)0x0) {
            lVar11 = (p_Var13->next_time).tv_sec;
            p_Var14 = p_Var13->next;
            if ((lVar11 < now.tv_sec) ||
               ((now.tv_sec == lVar11 && ((p_Var13->next_time).tv_usec < now.tv_usec)))) {
              increment_time(&p_Var13->next_time,p_Var13->period_sec,p_Var13->period_usec);
              if (p_Var13->executing == 0xffffffffffffffff) {
                p_Var13->executing = pVar6;
                (*svc->drop_CM_lock)
                          (sd->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                           ,0x1b3);
                (*p_Var13->func)(p_Var13->arg1,p_Var13->arg2);
                (*svc->acquire_CM_lock)
                          (sd->cm,
                           "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmepoll.c"
                           ,0x1b6);
                p_Var14 = p_Var13->next;
                p_Var13->executing = 0xffffffffffffffff;
                if ((p_Var13->period_sec == 0) && (p_Var13->period_usec == 0)) {
                  remove_periodic_task(sd,p_Var13);
                }
              }
              if (sd->closed != 0) {
                if (sd->wake_read_fd == -1) {
                  return;
                }
                close(sd->wake_read_fd);
                close(sd->wake_write_fd);
                sd->wake_read_fd = -1;
                sd->wake_write_fd = -1;
                return;
              }
            }
            p_Var13 = p_Var14;
            if (sd->select_consistency_number != local_1dc) {
              return;
            }
          }
          local_1dc = sd->select_consistency_number;
        }
        sd->select_consistency_number = local_1dc + 1;
        return;
      }
      if (sd->closed != 0) break;
      uVar1 = *(uint *)((long)&events[0].data + lVar11);
      if (((*(byte *)((long)&events[0].events + lVar11) & 1) != 0) &&
         (sd->select_items[(int)uVar1].func != (select_list_func)0x0)) {
        (*svc->verbose)(sd->cm,CMSelectVerbose,"Running select read action on fd %d",(ulong)uVar1);
        pFVar3 = sd->select_items;
        (*pFVar3[(int)uVar1].func)(pFVar3[(int)uVar1].arg1,pFVar3[(int)uVar1].arg2);
        if (sd->select_consistency_number != local_1dc) {
          return;
        }
      }
      if ((*(byte *)((long)&events[0].events + lVar11) & 4) != 0) {
        if (sd->write_items[(int)uVar1].func == (select_list_func)0x0) {
          fprintf(_stderr,"FD %d is polled, but no write item function.\n",(ulong)uVar1);
        }
        else {
          (*svc->verbose)(sd->cm,CMSelectVerbose,"Running select write action on fd %d",(ulong)uVar1
                         );
          pFVar3 = sd->write_items;
          (*pFVar3[(int)uVar1].func)(pFVar3[(int)uVar1].arg1,pFVar3[(int)uVar1].arg2);
        }
      }
      lVar11 = lVar11 + 0xc;
      if (sd->select_consistency_number != local_1dc) {
        return;
      }
    }
  }
LAB_00101de1:
  sd->server_thread = 0;
  return;
}

Assistant:

static void
socket_select(CMtrans_services svc, select_data_ptr sd, int timeout_sec, int timeout_usec)
{
    int i, res;
    int fd;
    struct epoll_event events[MAX_EVENTS];
    int ep_timeout;

    struct timeval timeout;
    int tmp_select_consistency_number = sd->select_consistency_number;

    if (sd->closed) {
	sd->server_thread =  (thr_thread_t) NULL; 
	return;
    }

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    if (sd->server_thread ==  (thr_thread_t) NULL) {
	/* no server thread set, must be this one */
	sd->server_thread = thr_thread_self();
    }
    if (sd->server_thread != thr_thread_self()) {
	/* What?  We're polling, but we're not the server thread? */
	fprintf(stderr, "Warning:  Multiple threads calling CManager_socket_select.\n");
	fprintf(stderr, "          This situation may result in unexpected I/O blocking.\n");
	fprintf(stderr, "          Server thread set to %lx.\n", (long) thr_thread_self());
	sd->server_thread = thr_thread_self();
    }
    if ((timeout_sec >= 0) || (sd->periodic_task_list != NULL)) {
	struct timeval now;
#ifndef HAVE_WINDOWS_H
	gettimeofday(&now, NULL);
#else
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
	struct _timeb nowb;
	_ftime(&nowb);
	now.tv_sec = nowb.time;
	now.tv_usec = nowb.millitm * 1000;
#endif
	if (timeout_usec >= 1000000) {
	    timeout_sec += (timeout_usec / 1000000);
	    timeout_usec = timeout_usec % 1000000;
	}
	timeout.tv_sec = timeout_sec;
	timeout.tv_usec = timeout_usec;
	
	set_soonest_timeout(&timeout, sd->periodic_task_list, now);
        svc->verbose(sd->cm, CMSelectVerbose, "CMSelect with timeout %d sec, %d usec", 
		       timeout.tv_sec, timeout.tv_usec);

	if (timeout.tv_sec == -1) {
	    timeout.tv_usec = 1;
	    timeout.tv_sec = 0;
	}
	DROP_CM_LOCK(svc, sd->cm);
	ep_timeout = (1000 * timeout.tv_sec) + (timeout.tv_usec / 1000);
        res = epoll_wait(sd->epfd, events, MAX_EVENTS, ep_timeout);

	ACQUIRE_CM_LOCK(svc, sd->cm);
    } else {
	svc->verbose(sd->cm, CMSelectVerbose, "CMSelect blocking select");
	DROP_CM_LOCK(svc, sd->cm);
	res = epoll_wait(sd->epfd, events, MAX_EVENTS, -1);

	ACQUIRE_CM_LOCK(svc, sd->cm);
    }
    if (sd->closed) {
	sd->server_thread =  (thr_thread_t) NULL; 
	return;
    }
#ifndef HAVE_WINDOWS_H
    if (res == -1) {
	if (errno == EINTR) {
	    return;
	}
	/* 
	 * if upon returning from select the consistency number
	 * has changed, the only safe thing to do is return so 
	 * that a new select can happen with consistent info.
	 */
	if (sd->select_consistency_number != 
	    tmp_select_consistency_number) return;
	if (errno == 0) {
	    /* 
	     * odd, but x86 Solaris seems to return -1 from select but not set
	     * the errno in some circumstances.  Just return when this happens.
	     */
	    return;
	}
	if (errno == EBADF) {
	    fprintf(stderr, "The epoll fd is invalid. This is catastrophic.\n");
	} else if (errno != EAGAIN) {
#ifdef HAVE_FDS_BITS
	    fprintf(stderr, "select failed, errno %d, rd_set was %lx, %lx,%lx, %lx\n\n", errno,
		    (long) ((fd_set *) sd->fdset)->fds_bits[0],
		    (long) ((fd_set *) sd->fdset)->fds_bits[1],
		    (long) ((fd_set *) sd->fdset)->fds_bits[2],
		    (long) ((fd_set *) sd->fdset)->fds_bits[3]);
	    fprintf(stderr, "timeout was %d and %d\n", timeout_sec, timeout_usec);
#else
	    fprintf(stderr, "select failed, errno %d\n", errno);
#endif
	    exit(1);
	    return;
	}
    }
#else
    /* 
     * Have to ignore the bad invalue for select on NT because it can't
     * do selects on files.  Otherwise you will get a bunch of
     * irritating select errors that aren't really errors 
     */
    if (res == SOCKET_ERROR) {
	int errno_val;
	errno_val = WSAGetLastError();
	if (errno_val == WSAEINTR || errno_val == WSAEINVAL) {
	    return;
	} else {
	    fprintf(stderr, "select failed, errno %d\n", 
		    WSAerror_str(errno_val));
	}
	return;
    }
#endif

#ifdef HAVE_FDS_BITS
    svc->verbose(sd->cm, CMSelectVerbose, "select returned, rd_set started %lx, %lx, %lx, %lx, result was %lx, %lx, %lx, %lx",
	    (long) ((fd_set *) sd->fdset)->fds_bits[0],
	    (long) ((fd_set *) sd->fdset)->fds_bits[1],
	    (long) ((fd_set *) sd->fdset)->fds_bits[2],
	    (long) ((fd_set *) sd->fdset)->fds_bits[3],
	    (long) ((fd_set *) &rd_set)->fds_bits[0],
	    (long) ((fd_set *) &rd_set)->fds_bits[1],
	    (long) ((fd_set *) &rd_set)->fds_bits[2],
	    (long) ((fd_set *) &rd_set)->fds_bits[3]);
    svc->verbose(sd->cm, CMSelectVerbose, "       write_set started %lx, %lx, %lx, %lx, result was %lx, %lx, %lx, %lx",
	    (long) ((fd_set *) sd->write_set)->fds_bits[0],
	    (long) ((fd_set *) sd->write_set)->fds_bits[1],
	    (long) ((fd_set *) sd->write_set)->fds_bits[2],
	    (long) ((fd_set *) sd->write_set)->fds_bits[3],
	    (long) ((fd_set *) &wr_set)->fds_bits[0],
	    (long) ((fd_set *) &wr_set)->fds_bits[1],
	    (long) ((fd_set *) &wr_set)->fds_bits[2],
	    (long) ((fd_set *) &wr_set)->fds_bits[3]);
#endif
    /* 
     * if upon returning from select the consistency number
     * has changed, the only safe thing to do is return so 
     * that a new select can happen with consistent info.
     */
    if (sd->select_consistency_number != 
	tmp_select_consistency_number) return;
    /* 
     * Careful!  We're reading the control list here without locking!
     * Something bad *might* happen, it's just unlikely.
     */
    for(i = 0; i < res; i++) {
    	if (sd->closed) {
    		sd->server_thread =  (thr_thread_t) NULL;
    		return;
    	}
    	fd = events[i].data.fd;
    	if(events[i].events & EPOLLIN) {
    		if(sd->select_items[fd].func != NULL) {
    			svc->verbose(sd->cm, CMSelectVerbose,
    				"Running select read action on fd %d", fd);
    			sd->select_items[fd].func(sd->select_items[fd].arg1,
    				sd->select_items[fd].arg2);
    		}
    	}
    	if (sd->select_consistency_number !=
    		tmp_select_consistency_number) return;
    	if(events[i].events & EPOLLOUT) {
    		if(sd->write_items[fd].func != NULL) {
    			svc->verbose(sd->cm, CMSelectVerbose,
    					"Running select write action on fd %d", fd);
    			sd->write_items[fd].func(sd->write_items[fd].arg1,
    				sd->write_items[fd].arg2);
    		} else {
    			fprintf(stderr, "FD %d is polled, but no write item function.\n", fd);
    		}
    	}
    	if (sd->select_consistency_number !=
    		tmp_select_consistency_number) return;
    }

    if (sd->periodic_task_list != NULL) {
	/* handle periodic tasks */
	periodic_task_handle this_periodic_task = sd->periodic_task_list;
	struct timeval now;

#ifndef HAVE_WINDOWS_H
	gettimeofday(&now, NULL);
#else
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
	struct _timeb nowb;
	_ftime(&nowb);
	now.tv_sec = nowb.time;
	now.tv_usec = nowb.millitm * 1000;
#endif
	while (this_periodic_task != NULL ) {
	    periodic_task_handle next = this_periodic_task->next;
	    if (timercmp(&now, &this_periodic_task->next_time, >)) {
		increment_time(&this_periodic_task->next_time,
			       this_periodic_task->period_sec,
			       this_periodic_task->period_usec);
		if (this_periodic_task->executing == (thr_thread_t)-1) {
		    this_periodic_task->executing = thr_thread_self();
		    DROP_CM_LOCK(svc, sd->cm);
		    this_periodic_task->func(this_periodic_task->arg1,
					     this_periodic_task->arg2);
		    ACQUIRE_CM_LOCK(svc, sd->cm);
		    next = this_periodic_task->next;
		    this_periodic_task->executing = (thr_thread_t) -1;
		    if ((this_periodic_task->period_sec == 0) &&
			(this_periodic_task->period_usec == 0)) {
		        remove_periodic_task(sd, this_periodic_task);
		    }
		}
		if (sd->closed) {
		    shutdown_wake_mechanism(sd);
		    return;
		}
	    }
	    /* 
	     * if upon returning from a handler the consistency number
	     * has changed, the only safe thing to do is return so 
	     * that a new select can happen with consistent info.
	     */
	    if (sd->select_consistency_number != 
		tmp_select_consistency_number) return;
	    this_periodic_task = next;
	}
    }
    sd->select_consistency_number++;
}